

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

_Bool parser_match_string(VrplibParser *p,char *string)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t local_38;
  _Bool result;
  size_t len;
  char *string_local;
  VrplibParser *p_local;
  
  parser_eat_whitespaces(p);
  sVar2 = parser_remainder_size(p);
  sVar3 = strlen(string);
  if (sVar2 < sVar3) {
    local_38 = parser_remainder_size(p);
  }
  else {
    local_38 = strlen(string);
  }
  iVar1 = strncmp(string,p->at,local_38);
  if (iVar1 == 0) {
    parser_adv(p,local_38);
  }
  parser_eat_whitespaces(p);
  return iVar1 == 0;
}

Assistant:

static bool parser_match_string(VrplibParser *p, char *string) {
    parser_eat_whitespaces(p);
    size_t len = MIN(parser_remainder_size(p), strlen(string));
    bool result = (0 == strncmp(string, p->at, len));

    if (result) {
        parser_adv(p, len);
    }
    parser_eat_whitespaces(p);
    return result;
}